

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

void calcBias<Blob<24>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  int *piVar4;
  int iBit;
  uint32_t bit;
  undefined3 in_register_00000081;
  int iOut;
  uint32_t bit_00;
  Blob<24> K;
  Blob<128> B;
  Blob<128> A;
  undefined2 local_88;
  undefined1 local_86;
  uint local_84;
  undefined4 local_80;
  int local_7c;
  pfHash local_78;
  ulong local_70;
  vector<int,_std::allocator<int>_> *local_68;
  Rand *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_80 = CONCAT31(in_register_00000081,verbose);
  local_86 = 0;
  local_88 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  if (0 < reps) {
    local_70 = (ulong)(uint)reps / 10;
    uVar3 = 0;
    local_84 = reps;
    local_78 = hash;
    local_68 = counts;
    local_60 = r;
    do {
      if (((char)local_80 != '\0') && ((int)(uVar3 % (local_70 & 0xffffffff)) == 0)) {
        putchar(0x2e);
      }
      local_7c = (int)uVar3;
      Rand::rand_p(local_60,&local_88,3);
      bit = 0;
      (*local_78)(&local_88,3,0,&local_48);
      piVar4 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_88,3,bit);
        (*local_78)(&local_88,3,0,&local_58);
        flipbit(&local_88,3,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(&local_48,0x10,bit_00);
          uVar2 = getbit(&local_58,0x10,bit_00);
          *piVar4 = *piVar4 + (uVar2 ^ uVar1);
          piVar4 = piVar4 + 1;
          bit_00 = bit_00 + 1;
        } while (bit_00 != 0x80);
        bit = bit + 1;
      } while (bit != 0x18);
      uVar3 = (ulong)(local_7c + 1U);
    } while (local_7c + 1U != local_84);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}